

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database_utils.c
# Opt level: O0

void bake_create_uni_query_db(char *table_name,int field_count,char **field_names,char **query)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  char *pcVar6;
  int local_50;
  int local_4c;
  int i_1;
  int insert_pos;
  int i;
  int query_length;
  char *query_ending;
  char *query_middle;
  char *query_beginning;
  char **query_local;
  char **field_names_local;
  int field_count_local;
  char *table_name_local;
  
  sVar2 = strlen("CREATE TABLE IF NOT EXISTS ");
  sVar3 = strlen(table_name);
  sVar4 = strlen(" ( ");
  sVar5 = strlen(");");
  insert_pos = (int)sVar2 + (int)sVar3 + (int)sVar4 + (int)sVar5 + 1;
  for (i_1 = 0; i_1 < field_count; i_1 = i_1 + 1) {
    sVar2 = strlen(field_names[i_1]);
    insert_pos = insert_pos + (int)sVar2 + 7;
  }
  pcVar6 = (char *)malloc((long)insert_pos);
  *query = pcVar6;
  if (*query != (char *)0x0) {
    local_4c = snprintf(*query,(long)insert_pos,"%s%s%s","CREATE TABLE IF NOT EXISTS ",table_name,
                        " ( ");
    for (local_50 = 0; local_50 < field_count + -1; local_50 = local_50 + 1) {
      iVar1 = snprintf(*query + local_4c,(long)insert_pos,"%s TEXT, ",field_names[local_50]);
      local_4c = iVar1 + local_4c;
    }
    iVar1 = snprintf(*query + local_4c,(long)insert_pos,"%s TEXT ",field_names[field_count + -1]);
    snprintf(*query + (iVar1 + local_4c),(long)insert_pos,"%s",");");
  }
  return;
}

Assistant:

void bake_create_uni_query_db(const char *table_name, int field_count, char **field_names, char **query) {
    char *query_beginning = "CREATE TABLE IF NOT EXISTS ";
    char *query_middle = " ( ";
    char *query_ending = ");";

    int query_length = strlen(query_beginning) + strlen(table_name) + strlen(query_middle) + strlen(query_ending) + 1;
    for (int i = 0; i < field_count; i++)
        query_length += strlen(field_names[i]) + 7;

    *query = malloc(query_length * sizeof(char));
    if (*query == NULL) {
        return;
    }
    int insert_pos = 0;

    insert_pos += snprintf(*query, query_length, "%s%s%s", query_beginning, table_name, query_middle);
    for (int i = 0; i < field_count - 1; i++)
        insert_pos += snprintf(*query + insert_pos, query_length, "%s TEXT, ", field_names[i]);
    insert_pos += snprintf(*query + insert_pos, query_length, "%s TEXT ", field_names[field_count - 1]);
    insert_pos += snprintf(*query + insert_pos, query_length, "%s", query_ending);
}